

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

int run_ping_pong_test(void)

{
  int iVar1;
  int extraout_EAX;
  uv_handle_type uVar2;
  uv_loop_t *puVar3;
  pinger_t *pinger;
  uv_tcp_t *tcp;
  uv_loop_t *unaff_RBX;
  anon_union_232_2_629321f6_for_stream *tcp_00;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_fd_t uStack_48;
  uv_os_fd_t uStack_44;
  uv_loop_t *puStack_40;
  long local_10;
  
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  local_10 = 1;
  if (completed_pingers == 1) {
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_10 = 0;
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (local_10 == iVar1) {
      uv_library_shutdown();
      return extraout_EAX;
    }
  }
  else {
    run_ping_pong_test_cold_1();
  }
  iVar1 = (int)&local_10;
  run_ping_pong_test_cold_2();
  puStack_40 = unaff_RBX;
  pinger = (pinger_t *)malloc(0x168);
  if (pinger == (pinger_t *)0x0) {
    socketpair_pinger_new_cold_11();
LAB_001abaa5:
    socketpair_pinger_new_cold_1();
LAB_001abab4:
    socketpair_pinger_new_cold_2();
LAB_001abac3:
    socketpair_pinger_new_cold_3();
LAB_001abad2:
    socketpair_pinger_new_cold_4();
LAB_001abae1:
    socketpair_pinger_new_cold_5();
LAB_001abaf0:
    socketpair_pinger_new_cold_10();
LAB_001abaf5:
    socketpair_pinger_new_cold_6();
LAB_001abb04:
    socketpair_pinger_new_cold_7();
  }
  else {
    pinger->vectored_writes = iVar1;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PONG;
    uv_default_loop();
    iVar1 = uv_socketpair(1,0,&uStack_48,0x40,0x40);
    if (iVar1 != 0) goto LAB_001abaa5;
    uVar2 = uv_guess_handle(uStack_48);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_001abab4;
    uVar2 = uv_guess_handle(uStack_44);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_001abac3;
    puVar3 = uv_default_loop();
    tcp_00 = &pinger->stream;
    iVar1 = uv_tcp_init(puVar3,&tcp_00->tcp);
    if (iVar1 != 0) goto LAB_001abad2;
    (pinger->stream).tcp.data = pinger;
    iVar1 = uv_tcp_open(&tcp_00->tcp,uStack_44);
    if (iVar1 != 0) goto LAB_001abae1;
    tcp = (uv_tcp_t *)malloc(0xd8);
    if (tcp == (uv_tcp_t *)0x0) goto LAB_001abaf0;
    tcp->data = (void *)0x0;
    puVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar3,tcp);
    if (iVar1 != 0) goto LAB_001abaf5;
    iVar1 = uv_tcp_open(tcp,uStack_48);
    if (iVar1 != 0) goto LAB_001abb04;
    pinger_write_ping(pinger);
    iVar1 = uv_read_start((uv_stream_t *)&tcp_00->tcp,alloc_cb,pinger_read_cb);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)tcp,alloc_cb,ponger_read_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001abb22;
    }
  }
  socketpair_pinger_new_cold_8();
LAB_001abb22:
  socketpair_pinger_new_cold_9();
  tcp_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  socketpair_pinger_new(1);
  run_ping_pong_test();
  return 0;
}

Assistant:

static int run_ping_pong_test(void) {
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, completed_pingers);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}